

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

int HistoQueueInit(HistoQueue *histo_queue,int max_size)

{
  void *pvVar1;
  undefined4 in_ESI;
  long *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  *(undefined4 *)(in_RDI + 1) = 0;
  *(undefined4 *)((long)in_RDI + 0xc) = in_ESI;
  pvVar1 = WebPSafeMalloc((uint64_t)in_RDI,CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  *in_RDI = (long)pvVar1;
  return (int)(*in_RDI != 0);
}

Assistant:

static int HistoQueueInit(HistoQueue* const histo_queue, const int max_size) {
  histo_queue->size = 0;
  histo_queue->max_size = max_size;
  // We allocate max_size + 1 because the last element at index "size" is
  // used as temporary data (and it could be up to max_size).
  histo_queue->queue = (HistogramPair*)WebPSafeMalloc(
      histo_queue->max_size + 1, sizeof(*histo_queue->queue));
  return histo_queue->queue != NULL;
}